

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O3

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::NodeIterator::
NodeIterator(NodeIterator *this,self_type *index)

{
  stack<alex::AlexNode<int,_int>_*,_std::deque<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>_>
  *this_00;
  iterator *piVar1;
  AlexNode<int,_int> **__args;
  AlexNode<int,_int> *pAVar2;
  _Elt_pointer ppAVar3;
  double dVar4;
  AlexNode<int,_int> *pAVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  model_node_type *node;
  
  this->index_ = index;
  this_00 = &this->node_stack_;
  this->cur_node_ = index->root_node_;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_map_size = 0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->node_stack_).c.
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>::
  _M_initialize_map((_Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                     *)this_00,0);
  pAVar2 = this->cur_node_;
  if ((pAVar2 != (AlexNode<int,_int> *)0x0) && (pAVar2->is_leaf_ == false)) {
    iVar7._0_1_ = pAVar2[1].is_leaf_;
    iVar7._1_1_ = pAVar2[1].duplication_factor_;
    iVar7._2_2_ = pAVar2[1].level_;
    __args = (AlexNode<int,_int> **)((long)pAVar2[1].model_.a_ + -8 + (long)iVar7 * 8);
    ppAVar3 = (this->node_stack_).c.
              super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppAVar3 ==
        (this->node_stack_).c.
        super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>>::
      _M_push_back_aux<alex::AlexNode<int,int>*const&>
                ((deque<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>> *)this_00
                 ,__args);
      iVar7._0_1_ = pAVar2[1].is_leaf_;
      iVar7._1_1_ = pAVar2[1].duplication_factor_;
      iVar7._2_2_ = pAVar2[1].level_;
    }
    else {
      *ppAVar3 = *__args;
      piVar1 = &(this->node_stack_).c.
                super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    if (1 < iVar7) {
      lVar8 = (ulong)(iVar7 - 2) << 3;
      lVar9 = (ulong)(iVar7 - 2) + 1;
      do {
        dVar4 = pAVar2[1].model_.a_;
        pAVar5 = *(AlexNode<int,_int> **)((long)dVar4 + -8 + lVar9 * 8);
        if (pAVar5 != *(AlexNode<int,_int> **)((long)dVar4 + lVar9 * 8)) {
          ppAVar3 = (this->node_stack_).c.
                    super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (ppAVar3 ==
              (this->node_stack_).c.
              super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>>::
            _M_push_back_aux<alex::AlexNode<int,int>*const&>
                      ((deque<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>> *)
                       this_00,(AlexNode<int,_int> **)((long)dVar4 + lVar8));
          }
          else {
            *ppAVar3 = pAVar5;
            piVar1 = &(this->node_stack_).c.
                      super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish;
            piVar1->_M_cur = piVar1->_M_cur + 1;
          }
        }
        lVar8 = lVar8 + -8;
        lVar10 = lVar9 + -1;
        bVar6 = 0 < lVar9;
        lVar9 = lVar10;
      } while (lVar10 != 0 && bVar6);
    }
  }
  return;
}

Assistant:

explicit NodeIterator(const self_type* index)
        : index_(index), cur_node_(index->root_node_) {
      if (cur_node_ && !cur_node_->is_leaf_) {
        auto node = static_cast<model_node_type*>(cur_node_);
        node_stack_.push(node->children_[node->num_children_ - 1]);
        for (int i = node->num_children_ - 2; i >= 0; i--) {
          if (node->children_[i] != node->children_[i + 1]) {
            node_stack_.push(node->children_[i]);
          }
        }
      }
    }